

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O2

QJsonArray __thiscall QJsonArray::fromStringList(QJsonArray *this,QStringList *list)

{
  QString *pQVar1;
  QString *s;
  long in_FS_OFFSET;
  QJsonValue local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->a).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray(this);
  pQVar1 = (list->d).ptr;
  for (s = pQVar1; s != pQVar1 + (list->d).size; s = s + 1) {
    QJsonValue::QJsonValue(&local_40,s);
    append(this,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    pQVar1 = (list->d).ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonArray QJsonArray::fromStringList(const QStringList &list)
{
    QJsonArray array;
    for (QStringList::const_iterator it = list.constBegin(); it != list.constEnd(); ++it)
        array.append(QJsonValue(*it));
    return array;
}